

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *__ptr;
  ssize_t sVar4;
  long lVar5;
  char *__s;
  ulong uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  buffers b;
  base64_timespec end;
  base64_timespec start;
  
  b.regsz = 0xa00000;
  b.encsz = 0x10aaaaa;
  pcVar3 = (char *)malloc(0xa00000);
  b.reg = pcVar3;
  if (pcVar3 == (char *)0x0) {
    __s = "Out of memory";
    iVar2 = 1;
    goto LAB_001025b3;
  }
  __ptr = (char *)malloc(0x10aaaaa);
  b.enc = __ptr;
  if (__ptr != (char *)0x0) {
    iVar1 = open("/dev/urandom",0);
    iVar2 = 1;
    if (-1 < iVar1) {
      printf("Filling buffer with %.1f MB of random data...\n",0x4024000000000000);
      uVar6 = 0;
LAB_00102269:
      if (uVar6 < 0xa00000) goto code_r0x00102272;
      close(iVar1);
      for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
        printf("Testing with buffer size %s, fastest of %d * %d\n",sizes[lVar5].label,
               (ulong)(uint)sizes[lVar5].repeat,(ulong)(uint)sizes[lVar5].batch);
        for (lVar7 = 0; codecs[lVar7] != (char *)0x0; lVar7 = lVar7 + 1) {
          iVar1 = 1 << ((byte)lVar7 & 0x1f);
          iVar2 = codec_supported(iVar1);
          if (iVar2 != 0) {
            pcVar3 = codecs[lVar7];
            b.regsz = sizes[lVar5].len;
            iVar2 = sizes[lVar5].repeat;
            fVar10 = -1.0;
            while (fVar11 = fVar10, bVar9 = iVar2 != 0, iVar2 = iVar2 + -1, bVar9) {
              base64_gettime(&start);
              iVar8 = sizes[lVar5].batch;
              while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                base64_encode(b.reg,b.regsz,b.enc,&b.encsz,iVar1);
              }
              base64_gettime(&end);
              fVar10 = ((float)(end.tv_nsec - start.tv_nsec) / 1e+09 +
                       (float)(end.tv_sec - start.tv_sec)) / (float)sizes[lVar5].batch;
              if (fVar11 <= fVar10 && 0.0 <= fVar11) {
                fVar10 = fVar11;
              }
            }
            printf("%s\tencode\t%.02f MB/sec\n",(double)(((float)b.regsz * 9.536743e-07) / fVar11),
                   pcVar3);
            b.encsz = sizes[lVar5].len;
            iVar2 = sizes[lVar5].repeat;
            fVar10 = -1.0;
            while (fVar11 = fVar10, bVar9 = iVar2 != 0, iVar2 = iVar2 + -1, bVar9) {
              base64_gettime(&start);
              iVar8 = sizes[lVar5].batch;
              while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                base64_decode(b.enc,b.encsz,b.reg,&b.regsz,iVar1);
              }
              base64_gettime(&end);
              fVar10 = ((float)(end.tv_nsec - start.tv_nsec) / 1e+09 +
                       (float)(end.tv_sec - start.tv_sec)) / (float)sizes[lVar5].batch;
              if (fVar11 <= fVar10 && 0.0 <= fVar11) {
                fVar10 = fVar11;
              }
            }
            printf("%s\tdecode\t%.02f MB/sec\n",(double)(((float)b.encsz * 9.536743e-07) / fVar11),
                   pcVar3);
          }
        }
      }
      __s = (char *)0x0;
      iVar2 = 0;
      __ptr = b.enc;
      goto LAB_0010257f;
    }
    __s = "Cannot open /dev/urandom";
    goto LAB_0010257f;
  }
  iVar2 = 1;
  __s = "Out of memory";
  goto LAB_0010258b;
code_r0x00102272:
  sVar4 = read(iVar1,pcVar3 + uVar6,0xa00000 - uVar6);
  uVar6 = uVar6 + sVar4;
  if (sVar4 < 0) goto code_r0x0010228e;
  goto LAB_00102269;
code_r0x0010228e:
  close(iVar1);
  __s = "Read error";
  iVar2 = 1;
LAB_0010257f:
  free(__ptr);
  pcVar3 = b.reg;
LAB_0010258b:
  free(pcVar3);
  if (__s == (char *)0x0) {
    return iVar2;
  }
LAB_001025b3:
  fputs(__s,_stderr);
  return iVar2;
}

Assistant:

int
main ()
{
	int ret = 0;
	char *errmsg = NULL;
	struct buffers b;

	// Set buffer sizes to largest buffer length:
	b.regsz = sizes[0].len;
	b.encsz = sizes[0].len * 5 / 3;

	// Allocate space for megabytes of random data:
	if ((b.reg = malloc(b.regsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err0;
	}

	// Allocate space for encoded output:
	if ((b.enc = malloc(b.encsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err1;
	}

	// Fill buffer with random data:
	if (get_random_data(&b, &errmsg) == false) {
		ret = 1;
		goto err2;
	}

	// Loop over all buffer sizes:
	for (size_t i = 0; i < sizeof(sizes) / sizeof(sizes[0]); i++) {
		printf("Testing with buffer size %s, fastest of %d * %d\n",
			sizes[i].label, sizes[i].repeat, sizes[i].batch);

		// Loop over all codecs:
		for (size_t j = 0; codecs[j]; j++)
			if (codec_supported(1 << j))
				codec_bench(&b, &sizes[i], codecs[j], 1 << j);
	};

	// Free memory:
err2:	free(b.enc);
err1:	free(b.reg);
err0:	if (errmsg)
		fputs(errmsg, stderr);

	return ret;
}